

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

cmList * __thiscall
cmList::sublist(cmList *__return_storage_ptr__,cmList *this,size_type pos,size_type length)

{
  size_type sVar1;
  out_of_range *this_00;
  ulong uVar2;
  size_type sVar3;
  size_type local_c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  const_iterator local_70;
  size_type local_68;
  size_type count;
  unsigned_long local_50;
  string local_48;
  size_type local_28;
  size_type length_local;
  size_type pos_local;
  cmList *this_local;
  
  local_28 = length;
  length_local = pos;
  pos_local = (size_type)this;
  this_local = __return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Values);
  if (sVar1 <= pos) {
    count._3_1_ = 1;
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Values);
    local_50 = sVar1 - 1;
    cmStrCat<char_const(&)[14],unsigned_long&,char_const(&)[22],unsigned_long>
              (&local_48,(char (*) [14])"begin index: ",&length_local,
               (char (*) [22])" is out of range 0 - ",&local_50);
    std::out_of_range::out_of_range(this_00,(string *)&local_48);
    count._3_1_ = 0;
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (local_28 != 0xffffffffffffffff) {
    uVar2 = length_local + local_28;
    sVar3 = size(this);
    if (uVar2 <= sVar3) {
      local_c0 = length_local + local_28;
      goto LAB_001b62e9;
    }
  }
  local_c0 = size(this);
LAB_001b62e9:
  local_68 = local_c0;
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)begin_abi_cxx11_(this);
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator+(&local_78,length_local);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)begin_abi_cxx11_(this);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator+(&local_88,local_68);
  sublist(__return_storage_ptr__,this,local_70,(const_iterator)local_80);
  return __return_storage_ptr__;
}

Assistant:

cmList cmList::sublist(size_type pos, size_type length) const
{
  if (pos >= this->Values.size()) {
    throw std::out_of_range(cmStrCat(
      "begin index: ", pos, " is out of range 0 - ", this->Values.size() - 1));
  }

  size_type count = (length == npos || pos + length > this->size())
    ? this->size()
    : pos + length;
  return this->sublist(this->begin() + pos, this->begin() + count);
}